

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction_manager.cpp
# Opt level: O2

ErrorData * __thiscall
duckdb::DuckTransactionManager::CommitTransaction
          (ErrorData *__return_storage_ptr__,DuckTransactionManager *this,ClientContext *context,
          Transaction *transaction_p)

{
  transaction_t new_commit_id;
  __uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_> *__u;
  unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true> __p;
  bool bVar1;
  byte bVar2;
  __int_type _Var3;
  pointer pDVar4;
  StorageManager *pSVar5;
  FatalException *this_00;
  InternalException *pIVar6;
  AttachedDatabase *extraout_RDX;
  AttachedDatabase *extraout_RDX_00;
  AttachedDatabase *extraout_RDX_01;
  AttachedDatabase *db;
  UndoBufferProperties UVar7;
  allocator local_181;
  _Head_base<0UL,_duckdb::StorageCommitState_*,_false> local_180;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> lock;
  unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>,_true>
  held_wal_lock;
  unique_lock<std::mutex> t_lock;
  unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
  top_cleanup_info;
  _Head_base<0UL,_duckdb::StorageCommitState_*,_false> local_138;
  UndoBufferProperties local_130;
  CheckpointDecision checkpoint_decision;
  unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
  cleanup_info;
  string local_c8 [88];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ::std::unique_lock<std::mutex>::unique_lock(&t_lock,&this->transaction_lock);
  bVar1 = AttachedDatabase::IsSystem((this->super_TransactionManager).db);
  if ((((!bVar1) &&
       (bVar1 = AttachedDatabase::IsTemporary((this->super_TransactionManager).db), !bVar1)) &&
      (bVar1 = DuckTransaction::ChangesMade((DuckTransaction *)transaction_p), bVar1)) &&
     (transaction_p->is_read_only == true)) {
    pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&cleanup_info,
               "Attempting to commit a transaction that is read-only but has made changes - this should not be possible"
               ,(allocator *)&checkpoint_decision);
    InternalException::InternalException(pIVar6,(string *)&cleanup_info);
    __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  lock.super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>.
  super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl =
       (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
       (__uniq_ptr_data<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true,_true>
        )0x0;
  UVar7 = DuckTransaction::GetUndoProperties((DuckTransaction *)transaction_p);
  local_130.estimated_size = UVar7.estimated_size;
  local_130._8_4_ = UVar7._8_4_;
  local_130.has_dropped_entries = UVar7.has_dropped_entries;
  CanCheckpoint(&checkpoint_decision,this,(DuckTransaction *)transaction_p,&lock,&local_130);
  ErrorData::ErrorData(__return_storage_ptr__);
  held_wal_lock.
  super_unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>.
  _M_t.
  super___uniq_ptr_impl<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::lock_guard<std::mutex>_*,_std::default_delete<std::lock_guard<std::mutex>_>_>
  .super__Head_base<0UL,_std::lock_guard<std::mutex>_*,_false>._M_head_impl =
       (unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>)
       (__uniq_ptr_data<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>,_true,_true>
        )0x0;
  local_180._M_head_impl = (StorageCommitState *)0x0;
  db = extraout_RDX;
  if ((checkpoint_decision.can_checkpoint == false) &&
     (bVar1 = DuckTransaction::ShouldWriteToWAL
                        ((DuckTransaction *)transaction_p,(this->super_TransactionManager).db),
     db = extraout_RDX_00, bVar1)) {
    if (transaction_p[3]._vptr_Transaction == (_func_int **)0x0) {
      pIVar6 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&cleanup_info,"Transaction writing to WAL does not have the write lock",
                 (allocator *)&top_cleanup_info);
      InternalException::InternalException(pIVar6,(string *)&cleanup_info);
      __cxa_throw(pIVar6,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::unique_lock<std::mutex>::unlock(&t_lock);
    make_uniq<std::lock_guard<std::mutex>,std::mutex&>((duckdb *)&cleanup_info,&this->wal_lock);
    __p = cleanup_info;
    cleanup_info.
    super_unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>._M_t.
    super___uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::DuckCleanupInfo_*,_std::default_delete<duckdb::DuckCleanupInfo>_>
    .super__Head_base<0UL,_duckdb::DuckCleanupInfo_*,_false>._M_head_impl =
         (unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>)
         (__uniq_ptr_data<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true,_true>
          )0x0;
    ::std::
    __uniq_ptr_impl<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
    ::reset((__uniq_ptr_impl<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
             *)&held_wal_lock,
            (pointer)__p.
                     super_unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::DuckCleanupInfo_*,_std::default_delete<duckdb::DuckCleanupInfo>_>
                     .super__Head_base<0UL,_duckdb::DuckCleanupInfo_*,_false>._M_head_impl);
    ::std::
    unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>::
    ~unique_ptr((unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
                 *)&cleanup_info);
    DuckTransaction::WriteToWAL
              ((ErrorData *)&cleanup_info,(DuckTransaction *)transaction_p,
               (this->super_TransactionManager).db,
               (unique_ptr<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>,_true>
                *)&local_180);
    ErrorData::operator=(__return_storage_ptr__,(ErrorData *)&cleanup_info);
    ErrorData::~ErrorData((ErrorData *)&cleanup_info);
    ::std::unique_lock<std::mutex>::lock(&t_lock);
    db = extraout_RDX_01;
  }
  new_commit_id = this->current_start_timestamp;
  this->current_start_timestamp = new_commit_id + 1;
  LOCK();
  (this->last_commit).super___atomic_base<unsigned_long>._M_i = new_commit_id;
  UNLOCK();
  bVar2 = __return_storage_ptr__->initialized;
  if ((bool)bVar2 == false) {
    local_138._M_head_impl = local_180._M_head_impl;
    local_180._M_head_impl = (StorageCommitState *)0x0;
    DuckTransaction::Commit
              ((ErrorData *)&cleanup_info,(DuckTransaction *)transaction_p,db,new_commit_id,
               (unique_ptr<duckdb::StorageCommitState,_std::default_delete<duckdb::StorageCommitState>,_true>
                *)&local_138);
    ErrorData::operator=(__return_storage_ptr__,(ErrorData *)&cleanup_info);
    ErrorData::~ErrorData((ErrorData *)&cleanup_info);
    if (local_138._M_head_impl != (StorageCommitState *)0x0) {
      (*(local_138._M_head_impl)->_vptr_StorageCommitState[1])();
    }
    local_138._M_head_impl = (StorageCommitState *)0x0;
    bVar2 = __return_storage_ptr__->initialized;
  }
  if ((bVar2 & 1) == 0) {
    if (0x400000000000005f < transaction_p[1].active_query.super___atomic_base<unsigned_long>._M_i)
    {
      _Var3 = this->last_committed_version + 1;
      this->last_committed_version = _Var3;
      LOCK();
      transaction_p[1].active_query.super___atomic_base<unsigned_long>._M_i = _Var3;
      UNLOCK();
    }
  }
  else {
    ::std::__cxx11::string::string
              ((string *)&local_70,(string *)&__return_storage_ptr__->final_message);
    CheckpointDecision::CheckpointDecision((CheckpointDecision *)&cleanup_info,&local_70);
    CheckpointDecision::operator=(&checkpoint_decision,(CheckpointDecision *)&cleanup_info);
    CheckpointDecision::~CheckpointDecision((CheckpointDecision *)&cleanup_info);
    ::std::__cxx11::string::~string((string *)&local_70);
    transaction_p[1].context.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    DuckTransaction::Rollback((ErrorData *)&cleanup_info,(DuckTransaction *)transaction_p);
    if ((char)cleanup_info.
              super_unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::DuckCleanupInfo_*,_std::default_delete<duckdb::DuckCleanupInfo>_>
              .super__Head_base<0UL,_duckdb::DuckCleanupInfo_*,_false>._M_head_impl == '\x01') {
      this_00 = (FatalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&top_cleanup_info,
                 "Failed to rollback transaction. Cannot continue operation.\nError: %s",&local_181)
      ;
      ::std::__cxx11::string::string((string *)&local_50,local_c8);
      FatalException::FatalException<std::__cxx11::string>
                (this_00,(string *)&top_cleanup_info,&local_50);
      __cxa_throw(this_00,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ErrorData::~ErrorData((ErrorData *)&cleanup_info);
  }
  (*(this->super_TransactionManager)._vptr_TransactionManager[7])
            (this,&checkpoint_decision,transaction_p);
  if ((checkpoint_decision.can_checkpoint == false) &&
     (lock.super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::StorageLockKey_*,_std::default_delete<duckdb::StorageLockKey>_>
      .super__Head_base<0UL,_duckdb::StorageLockKey_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true,_true>
       )0x0)) {
    ::std::__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
    reset((__uniq_ptr_impl<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
          &lock,(pointer)0x0);
  }
  RemoveTransaction((DuckTransactionManager *)&cleanup_info,(DuckTransaction *)this,
                    SUB81(transaction_p,0));
  pDVar4 = unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>::
           operator->(&cleanup_info);
  if ((pDVar4->transactions).
      super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pDVar4->transactions).
      super_vector<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckTransaction,_std::default_delete<duckdb::DuckTransaction>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::mutex::lock(&this->cleanup_queue_lock);
    ::std::
    deque<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>>
              ((deque<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,std::default_delete<duckdb::DuckCleanupInfo>,true>>>
                *)&this->cleanup_queue,&cleanup_info);
    pthread_mutex_unlock((pthread_mutex_t *)&this->cleanup_queue_lock);
  }
  ::std::unique_lock<std::mutex>::unlock(&t_lock);
  ::std::mutex::lock(&this->cleanup_lock);
  top_cleanup_info.
  super_unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::DuckCleanupInfo_*,_std::default_delete<duckdb::DuckCleanupInfo>_>.
  super__Head_base<0UL,_duckdb::DuckCleanupInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>)
       (__uniq_ptr_data<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true,_true>
        )0x0;
  ::std::mutex::lock(&this->cleanup_queue_lock);
  __u = (__uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_> *)
        (this->cleanup_queue).c.
        super__Deque_base<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((__uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_> *)
      (this->cleanup_queue).c.
      super__Deque_base<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != __u) {
    ::std::__uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>::
    operator=((__uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>
               *)&top_cleanup_info,__u);
    ::std::
    deque<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>_>_>
    ::pop_front(&(this->cleanup_queue).c);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->cleanup_queue_lock);
  if (top_cleanup_info.
      super_unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::DuckCleanupInfo_*,_std::default_delete<duckdb::DuckCleanupInfo>_>
      .super__Head_base<0UL,_duckdb::DuckCleanupInfo_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true,_true>
       )0x0) {
    pDVar4 = unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>,_true>
             ::operator->(&top_cleanup_info);
    DuckCleanupInfo::Cleanup(pDVar4);
  }
  ::std::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>::
  ~unique_ptr(&top_cleanup_info.
               super_unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>
             );
  pthread_mutex_unlock((pthread_mutex_t *)&this->cleanup_lock);
  if (checkpoint_decision.can_checkpoint == true) {
    pSVar5 = AttachedDatabase::GetStorageManager((this->super_TransactionManager).db);
    (*pSVar5->_vptr_StorageManager[5])(pSVar5,context,0x100000001,(ulong)checkpoint_decision.type);
  }
  ::std::unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>::
  ~unique_ptr(&cleanup_info.
               super_unique_ptr<duckdb::DuckCleanupInfo,_std::default_delete<duckdb::DuckCleanupInfo>_>
             );
  if (local_180._M_head_impl != (StorageCommitState *)0x0) {
    (*(local_180._M_head_impl)->_vptr_StorageCommitState[1])();
  }
  ::std::unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
  ::~unique_ptr(&held_wal_lock.
                 super_unique_ptr<std::lock_guard<std::mutex>,_std::default_delete<std::lock_guard<std::mutex>_>_>
               );
  CheckpointDecision::~CheckpointDecision(&checkpoint_decision);
  ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  ~unique_ptr(&lock.
               super_unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>
             );
  ::std::unique_lock<std::mutex>::~unique_lock(&t_lock);
  return __return_storage_ptr__;
}

Assistant:

ErrorData DuckTransactionManager::CommitTransaction(ClientContext &context, Transaction &transaction_p) {
	auto &transaction = transaction_p.Cast<DuckTransaction>();
	unique_lock<mutex> t_lock(transaction_lock);
	if (!db.IsSystem() && !db.IsTemporary()) {
		if (transaction.ChangesMade()) {
			if (transaction.IsReadOnly()) {
				throw InternalException("Attempting to commit a transaction that is read-only but has made changes - "
				                        "this should not be possible");
			}
		}
	}

	// check if we can checkpoint
	unique_ptr<StorageLockKey> lock;
	auto undo_properties = transaction.GetUndoProperties();
	auto checkpoint_decision = CanCheckpoint(transaction, lock, undo_properties);
	ErrorData error;
	unique_ptr<lock_guard<mutex>> held_wal_lock;
	unique_ptr<StorageCommitState> commit_state;
	if (!checkpoint_decision.can_checkpoint && transaction.ShouldWriteToWAL(db)) {
		// if we are committing changes and we are not checkpointing, we need to write to the WAL
		// since WAL writes can take a long time - we grab the WAL lock here and unlock the transaction lock
		// read-only transactions can bypass this branch and start/commit while the WAL write is happening
		if (!transaction.HasWriteLock()) {
			// sanity check - this transaction should have a write lock
			// the write lock prevents other transactions from checkpointing until this transaction is fully finished
			// if we do not hold the write lock here, other transactions can bypass this branch by auto-checkpoint
			// this would lead to a checkpoint WHILE this thread is writing to the WAL
			// this should never happen
			throw InternalException("Transaction writing to WAL does not have the write lock");
		}
		// unlock the transaction lock while we write to the WAL
		t_lock.unlock();
		// grab the WAL lock and hold it until the entire commit is finished
		held_wal_lock = make_uniq<lock_guard<mutex>>(wal_lock);
		error = transaction.WriteToWAL(db, commit_state);

		// after we finish writing to the WAL we grab the transaction lock again
		t_lock.lock();
	}
	// obtain a commit id for the transaction
	transaction_t commit_id = GetCommitTimestamp();
	// commit the UndoBuffer of the transaction
	if (!error.HasError()) {
		error = transaction.Commit(db, commit_id, std::move(commit_state));
	}
	if (error.HasError()) {
		// commit unsuccessful: rollback the transaction instead
		checkpoint_decision = CheckpointDecision(error.Message());
		transaction.commit_id = 0;
		auto rollback_error = transaction.Rollback();
		if (rollback_error.HasError()) {
			throw FatalException("Failed to rollback transaction. Cannot continue operation.\nError: %s",
			                     rollback_error.Message());
		}
	} else {
		// check if catalog changes were made
		if (transaction.catalog_version >= TRANSACTION_ID_START) {
			transaction.catalog_version = ++last_committed_version;
		}
	}
	OnCommitCheckpointDecision(checkpoint_decision, transaction);

	if (!checkpoint_decision.can_checkpoint && lock) {
		// we won't checkpoint after all: unlock the checkpoint lock again
		lock.reset();
	}

	// commit successful: remove the transaction id from the list of active transactions
	// potentially resulting in garbage collection
	bool store_transaction = undo_properties.has_updates || undo_properties.has_index_deletes ||
	                         undo_properties.has_catalog_changes || error.HasError();

	// Remove the transaction from the list of active transactions and gather cleanup information.
	auto cleanup_info = RemoveTransaction(transaction, store_transaction);
	if (cleanup_info->ScheduleCleanup()) {
		lock_guard<mutex> q_lock(cleanup_queue_lock);
		cleanup_queue.emplace(std::move(cleanup_info));
	}

	// We do not need to hold the transaction lock during cleanup of transactions,
	// as they (1) have been removed, or (2) exited old_transactions.
	t_lock.unlock();

	{
		lock_guard<mutex> c_lock(cleanup_lock);
		unique_ptr<DuckCleanupInfo> top_cleanup_info;
		{
			lock_guard<mutex> q_lock(cleanup_queue_lock);
			if (!cleanup_queue.empty()) {
				top_cleanup_info = std::move(cleanup_queue.front());
				cleanup_queue.pop();
			}
		}
		if (top_cleanup_info) {
			top_cleanup_info->Cleanup();
		}
	}

	// now perform a checkpoint if (1) we are able to checkpoint, and (2) the WAL has reached sufficient size to
	// checkpoint
	if (checkpoint_decision.can_checkpoint) {
		D_ASSERT(lock);
		// we can unlock the transaction lock while checkpointing
		// checkpoint the database to disk
		CheckpointOptions options;
		options.action = CheckpointAction::ALWAYS_CHECKPOINT;
		options.type = checkpoint_decision.type;
		auto &storage_manager = db.GetStorageManager();
		storage_manager.CreateCheckpoint(context, options);
	}
	return error;
}